

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogConverterCustomText.h
# Opt level: O2

void __thiscall
nowtech::log::
ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)'d',_true,_false>
::append<unsigned_long>
          (ConverterCustomText<nowtech::log::MessageCompact<8UL,_true>,_true,_(unsigned_char)_d_,_true,_false>
           *this,unsigned_long aValue,unsigned_long aBase,uint8_t aFill)

{
  char *pcVar1;
  Iterator pcVar2;
  char cVar3;
  uint uVar4;
  Iterator pcVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  char tmpBuffer [100];
  
  if (0xfffffffffffffff0 < aBase - 0x11) {
    if (aBase == 0x10) {
      pcVar2 = this->mBegin;
      pcVar5 = this->mEnd;
      if (pcVar2 < pcVar5) {
        *pcVar2 = '0';
        pcVar5 = this->mEnd;
        pcVar2 = this->mBegin + 1;
        this->mBegin = pcVar2;
      }
      if (pcVar2 < pcVar5) {
        *pcVar2 = 'x';
        goto LAB_00103f31;
      }
    }
    else if (aBase != 10) {
      if (aBase == 2) {
        pcVar2 = this->mBegin;
        pcVar5 = this->mEnd;
        if (pcVar2 < pcVar5) {
          *pcVar2 = '0';
          pcVar5 = this->mEnd;
          pcVar2 = this->mBegin + 1;
          this->mBegin = pcVar2;
        }
        if (pcVar2 < pcVar5) {
          *pcVar2 = 'b';
LAB_00103f31:
          this->mBegin = this->mBegin + 1;
        }
      }
      else {
        pcVar2 = this->mBegin;
        pcVar5 = this->mEnd;
        if (pcVar2 < pcVar5) {
          *pcVar2 = '0';
          pcVar5 = this->mEnd;
          pcVar2 = this->mBegin + 1;
          this->mBegin = pcVar2;
        }
        if (pcVar2 < pcVar5) {
          *pcVar2 = '!';
          goto LAB_00103f31;
        }
      }
    }
    uVar7 = 0;
    do {
      uVar6 = uVar7;
      tmpBuffer[uVar6] = "0123456789abcdef"[aValue % aBase];
      uVar7 = uVar6 + 1;
      if (0x62 < uVar6) break;
      bVar8 = aBase <= aValue;
      aValue = aValue / aBase;
    } while (bVar8);
    if (uVar6 < 99) {
      if ((byte)uVar7 < aFill) {
        uVar4 = (uint)aFill - (int)uVar7;
        while (cVar3 = (char)uVar4, uVar4 = (uint)(byte)(cVar3 - 1), cVar3 != '\0') {
          if (this->mBegin < this->mEnd) {
            *this->mBegin = '0';
            this->mBegin = this->mBegin + 1;
          }
        }
      }
      while( true ) {
        uVar7 = uVar6;
        pcVar1 = this->mBegin;
        if (uVar7 == 0) break;
        uVar6 = uVar7 - 1;
        if (pcVar1 < this->mEnd) {
          *pcVar1 = tmpBuffer[uVar7];
          this->mBegin = this->mBegin + 1;
        }
      }
      if (this->mEnd <= pcVar1) {
        return;
      }
      *pcVar1 = tmpBuffer[0];
      goto LAB_00103fc5;
    }
  }
  if (this->mEnd <= this->mBegin) {
    return;
  }
  *this->mBegin = '#';
LAB_00103fc5:
  this->mBegin = this->mBegin + 1;
  return;
}

Assistant:

void append(tValue const aValue, tValue const aBase, uint8_t const aFill) noexcept {
    tValue tmpValue = aValue;
    uint8_t tmpFill = aFill;
    if((aBase <= NumericSystem::csInvalid) || (aBase > NumericSystem::csBaseMax)) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(tAppendBasePrefix) {
      if (aBase == 2u) {
        append(csNumericFill);
        append(csNumericMarkBinary);
      }
      else if(aBase == 16u) {
        append(csNumericFill);
        append(csNumericMarkHexadecimal);
      }
      else if(aBase != 10u) {
        append(csNumericFill);
        append(csNumericMarkOther);
      }
      else { // nothing to do
      }
    }
    char tmpBuffer[tAppendStackBufferSize];
    uint8_t where = 0u;
    bool negative = aValue < 0;
    do {
      tValue mod = tmpValue % aBase;
      if(mod < 0) {
        mod = -mod;
      }
      else { // nothing to do
      }
      tmpBuffer[where] = csDigit2char[mod];
      ++where;
      tmpValue /= aBase;
    } while((tmpValue != 0) && (where < tAppendStackBufferSize));
    if(where >= tAppendStackBufferSize) {
      append(csNumericError);
      return;
    }
    else { // nothing to do
    }
    if(negative) {
      append(csMinus);
    }
    else if(tAlignSigned && (aFill > 0u)) {
      append(csSpace);
    }
    else { // nothing to do
    }
    if(tmpFill > where) {
      tmpFill -= where;
      while(tmpFill > 0u) {
        append(csNumericFill);
        --tmpFill;
      }
    }
    for(--where; where > 0u; --where) {
      append(tmpBuffer[where]);
    }
    append(tmpBuffer[0]);
  }